

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::writeMPS(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,ostream *p_output,NameSet *p_rnames,NameSet *p_cnames,DIdxSet *p_intvars,
          bool writeZeroObjective)

{
  undefined4 uVar1;
  uint uVar2;
  bool bVar3;
  type_conflict5 tVar4;
  int iVar5;
  uint uVar6;
  SPxSense SVar7;
  Verbosity VVar8;
  ostream *poVar9;
  ulong *puVar10;
  undefined8 uVar11;
  element_type *this_00;
  int __c;
  int __c_00;
  int __c_01;
  NameSet *in_RSI;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  IdxSet *in_R8;
  byte in_R9B;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhsval2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhsval1;
  int colsize2;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *col;
  bool is_intvar;
  bool is_intrun;
  int j;
  bool has_intvars;
  int k;
  int i;
  bool has_ranges;
  char name2 [16];
  char name1 [16];
  char name [16];
  char *indicator;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  string *in_stack_ffffffffffffece8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  undefined4 in_stack_ffffffffffffecf0;
  int in_stack_ffffffffffffecf4;
  NameSet *in_stack_ffffffffffffecf8;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffed00;
  int idx;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffed08;
  double in_stack_ffffffffffffed58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffed60;
  type_conflict5 local_1291;
  undefined4 in_stack_ffffffffffffed88;
  undefined4 in_stack_ffffffffffffed8c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffed90;
  NameSet *in_stack_ffffffffffffed98;
  char *in_stack_ffffffffffffeda0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffeda8;
  ostream *in_stack_ffffffffffffedb0;
  type_conflict5 local_1245;
  NameSet *in_stack_ffffffffffffedc0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffedc8;
  NameSet *in_stack_ffffffffffffedd0;
  byte local_11da;
  bool local_1181;
  bool local_1179;
  bool local_1169;
  type_conflict5 local_1119;
  undefined4 local_1100;
  Verbosity local_10fc;
  undefined8 local_10f8;
  undefined1 local_10f0 [232];
  undefined1 local_1008 [56];
  pointer local_fd0;
  undefined1 local_fc8 [56];
  undefined8 local_f90;
  undefined1 local_f88 [56];
  DataKey *local_f50;
  undefined1 local_f48 [184];
  pointer local_e90;
  undefined1 local_e88 [64];
  undefined1 local_e48 [56];
  undefined1 local_e10 [56];
  pointer local_dd8;
  undefined1 local_dd0 [56];
  DataKey *local_d98;
  undefined1 local_d90 [176];
  undefined1 local_ce0 [56];
  undefined1 local_ca8 [56];
  pointer local_c70;
  undefined1 local_c68 [56];
  Item *local_c30;
  undefined1 local_c28 [168];
  undefined1 local_b80 [56];
  double local_b48;
  undefined1 local_b40 [56];
  undefined1 local_b08 [56];
  undefined1 local_ad0 [56];
  undefined8 local_a98;
  undefined1 local_a90 [56];
  undefined1 local_a58 [56];
  undefined1 local_a20 [56];
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_9e8;
  undefined1 local_9e0 [56];
  undefined8 local_9a8;
  undefined1 local_9a0 [56];
  undefined8 local_968;
  undefined1 local_960 [252];
  undefined1 local_864 [56];
  undefined1 local_82c [131];
  bool local_7a9;
  uint local_7a8;
  bool local_7a1;
  undefined8 local_7a0;
  undefined1 local_798 [184];
  int *local_6e0;
  undefined1 local_6d8 [59];
  undefined1 local_69d;
  allocator local_689;
  string local_688 [32];
  undefined1 local_668 [56];
  pointer local_630;
  undefined1 local_628 [56];
  undefined1 local_5f0 [56];
  element_type *local_5b8;
  undefined1 local_5ac [56];
  uint local_574;
  uint local_570;
  byte local_569;
  char *local_538;
  byte local_529;
  IdxSet *local_528;
  NameSet *local_510;
  undefined8 local_500;
  element_type **local_4f8;
  undefined1 *local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined1 *local_4d8;
  undefined8 local_4d0;
  pointer *local_4c8;
  undefined1 *local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined1 *local_4a8;
  undefined8 local_4a0;
  int **local_498;
  undefined1 *local_490;
  undefined8 local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  undefined8 local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  undefined8 local_458;
  undefined8 *local_450;
  undefined1 *local_448;
  undefined8 local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  undefined8 local_428;
  undefined8 *local_420;
  undefined1 *local_418;
  undefined8 local_410;
  undefined8 *local_408;
  undefined1 *local_400;
  undefined8 local_3f8;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  **local_3f0;
  undefined1 *local_3e8;
  undefined8 local_3e0;
  Item **local_3d8;
  undefined1 *local_3d0;
  undefined8 local_3c8;
  pointer *local_3c0;
  undefined1 *local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  undefined1 *local_3a0;
  undefined8 local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  undefined8 local_380;
  DataKey **local_378;
  undefined1 *local_370;
  undefined8 local_368;
  pointer *local_360;
  undefined1 *local_358;
  undefined8 local_350;
  undefined8 local_348;
  undefined1 *local_340;
  undefined8 local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  undefined8 local_320;
  pointer *local_318;
  undefined1 *local_310;
  undefined8 local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  undefined8 local_2f0;
  DataKey **local_2e8;
  undefined1 *local_2e0;
  undefined8 local_2d8;
  undefined8 *local_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  pointer *local_2b8;
  undefined1 *local_2b0;
  undefined8 local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined1 *local_280;
  undefined8 local_278;
  undefined8 *local_270;
  undefined1 *local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_260;
  undefined1 *local_258;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_250;
  undefined1 *local_248;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_240;
  undefined1 *local_238;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_230;
  undefined1 *local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_220;
  undefined1 *local_218;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_210;
  undefined1 *local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_200;
  undefined1 *local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b0;
  undefined1 *local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a0;
  undefined1 *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  undefined1 *local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  undefined8 *local_150;
  undefined8 local_148;
  undefined1 *local_140;
  pointer *local_138;
  undefined8 *local_130;
  DataKey **local_128;
  undefined1 *local_120;
  pointer *local_118;
  undefined1 *local_110;
  undefined8 local_108;
  pointer *local_100;
  DataKey **local_f8;
  undefined1 *local_f0;
  undefined8 local_e8;
  pointer *local_e0;
  Item **local_d8;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  **local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined1 *local_b8;
  undefined8 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  int **local_98;
  undefined8 local_90;
  pointer *local_88;
  undefined8 local_80;
  element_type **local_78;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_69;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_529 = in_R9B & 1;
  local_569 = 0;
  local_528 = in_R8;
  local_510 = in_RSI;
  SPxOut::setScientific
            ((ostream *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
             (int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
  poVar9 = std::operator<<((ostream *)local_510,"NAME          MPSDATA");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)local_510,"ROWS");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  for (local_570 = 0; uVar6 = local_570,
      iVar5 = nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x304381), (int)uVar6 < iVar5; local_570 = local_570 + 1) {
    lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
        (int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
    rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
        (int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
    bVar3 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffece8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x3043d2);
    if (bVar3) {
      local_538 = "E";
    }
    else {
      lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
          (int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
      puVar10 = (ulong *)infinity();
      local_5b8 = (element_type *)(*puVar10 ^ 0x8000000000000000);
      local_4f0 = local_5ac;
      local_4f8 = &local_5b8;
      local_500 = 0;
      local_78 = local_4f8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                 (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
      tVar4 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffece8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x30449f);
      local_1119 = false;
      if (tVar4) {
        rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
            (int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
        local_4e0 = infinity();
        local_4d8 = local_5f0;
        local_4e8 = 0;
        local_80 = local_4e0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                   (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
        local_1119 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)in_stack_ffffffffffffece8,
                                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)0x30453b);
      }
      if (local_1119 == false) {
        lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
            (int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
        puVar10 = (ulong *)infinity();
        local_630 = (pointer)(*puVar10 ^ 0x8000000000000000);
        local_4c0 = local_628;
        local_4c8 = &local_630;
        local_4d0 = 0;
        local_88 = local_4c8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                   (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
        tVar4 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffece8,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x30461e);
        if (tVar4) {
          local_538 = "G";
        }
        else {
          rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
              (int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
          local_4b0 = infinity();
          local_4a8 = local_668;
          local_4b8 = 0;
          local_90 = local_4b0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                     (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
          tVar4 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffece8,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x3046bf);
          if (!tVar4) {
            local_69d = 1;
            uVar11 = __cxa_allocate_exception(0x28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_688,"XMPSWR02 This should never happen.",&local_689);
            SPxInternalCodeException::SPxInternalCodeException
                      ((SPxInternalCodeException *)
                       CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                       in_stack_ffffffffffffece8);
            local_69d = 0;
            __cxa_throw(uVar11,&SPxInternalCodeException::typeinfo,
                        SPxInternalCodeException::~SPxInternalCodeException);
          }
          local_538 = "L";
        }
      }
      else {
        local_538 = "E";
        local_569 = 1;
      }
    }
    MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (in_stack_ffffffffffffed08,(int)((ulong)in_stack_ffffffffffffed00 >> 0x20),
               in_stack_ffffffffffffecf8,
               (char *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
    local_6e0 = (int *)0x0;
    local_490 = local_6d8;
    local_498 = &local_6e0;
    local_4a0 = 0;
    local_98 = local_498;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
               (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
    local_798._120_8_ = (pointer)0x0;
    local_478 = local_798 + 0x80;
    local_480 = local_798 + 0x78;
    local_488 = 0;
    local_a0 = local_480;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
               (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
    in_stack_ffffffffffffece8 = (string *)(local_798 + 0x80);
    MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (in_stack_ffffffffffffedb0,(char *)in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0
               ,(char *)in_stack_ffffffffffffed98,in_stack_ffffffffffffed90,
               (char *)CONCAT44(in_stack_ffffffffffffed8c,in_stack_ffffffffffffed88),
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_stack_ffffffffffffedc0);
  }
  local_798._56_8_ = 0;
  local_460 = local_798 + 0x40;
  local_468 = local_798 + 0x38;
  local_470 = 0;
  local_a8 = local_468;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
             (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
  local_7a0 = 0;
  local_448 = local_798;
  local_450 = &local_7a0;
  local_458 = 0;
  local_b0 = local_450;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
             (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
  this_01 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)local_798;
  MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (in_stack_ffffffffffffedb0,(char *)in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0,
             (char *)in_stack_ffffffffffffed98,in_stack_ffffffffffffed90,
             (char *)CONCAT44(in_stack_ffffffffffffed8c,in_stack_ffffffffffffed88),
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)in_stack_ffffffffffffedc0);
  poVar9 = std::operator<<((ostream *)local_510,"COLUMNS");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  local_1169 = false;
  if (local_528 != (IdxSet *)0x0) {
    iVar5 = IdxSet::size(local_528);
    local_1169 = 0 < iVar5;
  }
  local_7a1 = local_1169;
  local_7a8 = 0;
  while( true ) {
    iVar5 = 1;
    if ((local_7a1 & 1U) != 0) {
      iVar5 = 2;
    }
    if (iVar5 <= (int)local_7a8) break;
    bVar3 = (local_7a1 & 1U) != 0;
    local_1179 = bVar3 && local_7a8 == 1;
    local_7a9 = local_1179;
    if (bVar3 && local_7a8 == 1) {
      poVar9 = std::operator<<((ostream *)local_510,
                               "    MARK0001  \'MARKER\'                 \'INTORG\'");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    for (local_570 = 0; uVar6 = local_570,
        iVar5 = nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x304b5f), (int)uVar6 < iVar5; local_570 = local_570 + 1) {
      local_1181 = false;
      if ((local_7a1 & 1U) != 0) {
        iVar5 = IdxSet::pos((IdxSet *)in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf4);
        local_1181 = -1 < iVar5;
      }
      local_82c[0x82] = local_1181;
      if ((((local_7a9 & 1U) == 0) || (local_1181 != false)) &&
         (((local_7a9 & 1U) != 0 || (local_1181 == false)))) {
        local_82c._116_8_ =
             colVector((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                       (int)((ulong)this_01 >> 0x20));
        iVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)local_82c._116_8_);
        local_82c._112_4_ = iVar5 / 2 << 1;
        for (local_574 = 0; uVar1 = local_82c._112_4_, (int)local_574 < (int)local_82c._112_4_;
            local_574 = local_574 + 2) {
          getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (in_stack_ffffffffffffed08,(int)((ulong)in_stack_ffffffffffffed00 >> 0x20),
                     in_stack_ffffffffffffecf8,
                     (char *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::index((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)local_82c._116_8_,(char *)(ulong)local_574,__c);
          MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (in_stack_ffffffffffffed08,(int)((ulong)in_stack_ffffffffffffed00 >> 0x20),
                     in_stack_ffffffffffffecf8,
                     (char *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
          local_260 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::value((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)local_82c._116_8_,local_574);
          local_258 = local_82c + 0x38;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                     (cpp_dec_float<50U,_int,_void> *)this_01);
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::index((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)local_82c._116_8_,(char *)(ulong)(local_574 + 1),__c_00);
          MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (in_stack_ffffffffffffed08,(int)((ulong)in_stack_ffffffffffffed00 >> 0x20),
                     in_stack_ffffffffffffecf8,
                     (char *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
          local_250 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::value((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)local_82c._116_8_,local_574 + 1);
          local_248 = local_82c;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                     (cpp_dec_float<50U,_int,_void> *)this_01);
          this_01 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)local_82c;
          MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (in_stack_ffffffffffffedb0,(char *)in_stack_ffffffffffffeda8,
                     in_stack_ffffffffffffeda0,(char *)in_stack_ffffffffffffed98,
                     in_stack_ffffffffffffed90,
                     (char *)CONCAT44(in_stack_ffffffffffffed8c,in_stack_ffffffffffffed88),
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_ffffffffffffedc0);
        }
        uVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)local_82c._116_8_);
        if (uVar1 != uVar6) {
          getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (in_stack_ffffffffffffed08,(int)((ulong)in_stack_ffffffffffffed00 >> 0x20),
                     in_stack_ffffffffffffecf8,
                     (char *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::index((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)local_82c._116_8_,(char *)(ulong)local_574,__c_01);
          MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (in_stack_ffffffffffffed08,(int)((ulong)in_stack_ffffffffffffed00 >> 0x20),
                     in_stack_ffffffffffffecf8,
                     (char *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
          local_240 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::value((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)local_82c._116_8_,local_574);
          local_238 = local_864;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                     (cpp_dec_float<50U,_int,_void> *)this_01);
          local_960._184_8_ = (int *)0x0;
          local_430 = local_960 + 0xc4;
          local_438 = local_960 + 0xb8;
          local_440 = 0;
          local_b8 = local_438;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                     (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
          this_01 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)(local_960 + 0xc4);
          MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (in_stack_ffffffffffffedb0,(char *)in_stack_ffffffffffffeda8,
                     in_stack_ffffffffffffeda0,(char *)in_stack_ffffffffffffed98,
                     in_stack_ffffffffffffed90,
                     (char *)CONCAT44(in_stack_ffffffffffffed8c,in_stack_ffffffffffffed88),
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_ffffffffffffedc0);
        }
        local_230 = maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                           (int)((ulong)this_01 >> 0x20));
        local_228 = local_960 + 0x80;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                   (cpp_dec_float<50U,_int,_void> *)this_01);
        tolerances(this_01);
        this_00 = std::
                  __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x304fb4);
        Tolerances::epsilon(this_00);
        bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (in_stack_ffffffffffffed60,in_stack_ffffffffffffed58);
        local_11da = 1;
        if (!bVar3) {
          local_11da = local_529;
        }
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x305026)
        ;
        if ((local_11da & 1) != 0) {
          getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (in_stack_ffffffffffffed08,(int)((ulong)in_stack_ffffffffffffed00 >> 0x20),
                     in_stack_ffffffffffffecf8,
                     (char *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
          local_28 = maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                            (int)((ulong)this_01 >> 0x20));
          local_20 = local_960 + 0x38;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_29,local_28);
          local_10 = local_960 + 0x38;
          local_18 = local_28;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                     (cpp_dec_float<50U,_int,_void> *)this_01);
          local_8 = local_960 + 0x38;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
          local_968 = 0;
          local_418 = local_960;
          local_420 = &local_968;
          local_428 = 0;
          local_c0 = local_420;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                     (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
          this_01 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)local_960;
          MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (in_stack_ffffffffffffedb0,(char *)in_stack_ffffffffffffeda8,
                     in_stack_ffffffffffffeda0,(char *)in_stack_ffffffffffffed98,
                     in_stack_ffffffffffffed90,
                     (char *)CONCAT44(in_stack_ffffffffffffed8c,in_stack_ffffffffffffed88),
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_ffffffffffffedc0);
        }
      }
    }
    if ((local_7a9 & 1U) != 0) {
      poVar9 = std::operator<<((ostream *)local_510,
                               "    MARK0001  \'MARKER\'                 \'INTEND\'");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    local_7a8 = local_7a8 + 1;
  }
  poVar9 = std::operator<<((ostream *)local_510,"RHS");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  local_570 = 0;
  do {
    do {
      uVar6 = local_570;
      iVar5 = nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x305270);
      if (iVar5 <= (int)uVar6) {
        if ((local_569 & 1) != 0) {
          poVar9 = std::operator<<((ostream *)local_510,"RANGES");
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          for (local_570 = 0; uVar6 = local_570,
              iVar5 = nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x3058d4), (int)uVar6 < iVar5; local_570 = local_570 + 1) {
            in_stack_ffffffffffffedb0 =
                 (ostream *)
                 lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                     (int)((ulong)this_01 >> 0x20));
            puVar10 = (ulong *)infinity();
            local_c70 = (pointer)(*puVar10 ^ 0x8000000000000000);
            local_3b8 = local_c68;
            local_3c0 = &local_c70;
            local_3c8 = 0;
            local_e0 = local_3c0;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                       (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
            tVar4 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)this_01,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x305998);
            local_1245 = false;
            if (tVar4) {
              in_stack_ffffffffffffeda8 =
                   rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                       (int)((ulong)this_01 >> 0x20));
              local_3a8 = infinity();
              local_3a0 = local_ca8;
              local_3b0 = 0;
              local_e8 = local_3a8;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                        (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                         (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
              local_1245 = boost::multiprecision::operator<
                                     ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)this_01,
                                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)0x305a34);
            }
            if (local_1245 != false) {
              in_stack_ffffffffffffed98 = local_510;
              in_stack_ffffffffffffeda0 =
                   MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (in_stack_ffffffffffffed08,
                              (int)((ulong)in_stack_ffffffffffffed00 >> 0x20),
                              in_stack_ffffffffffffecf8,
                              (char *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0))
              ;
              in_stack_ffffffffffffed90 =
                   rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                       (int)((ulong)this_01 >> 0x20));
              local_68 = lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                             (int)((ulong)this_01 >> 0x20));
              local_58 = local_ce0;
              local_60 = in_stack_ffffffffffffed90;
              boost::multiprecision::detail::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
              ::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_69,in_stack_ffffffffffffed90,local_68);
              local_50 = local_ce0;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
              local_38 = local_ce0;
              local_40 = local_60;
              local_48 = local_68;
              boost::multiprecision::default_ops::
              eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        ((cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                         (cpp_dec_float<50U,_int,_void> *)this_01,
                         (cpp_dec_float<50U,_int,_void> *)0x305b66);
              local_d90._112_8_ = (pointer)0x0;
              local_388 = local_d90 + 0x78;
              local_390 = local_d90 + 0x70;
              local_398 = 0;
              local_f0 = local_390;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                        (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                         (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
              this_01 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)(local_d90 + 0x78);
              MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_ffffffffffffedb0,(char *)in_stack_ffffffffffffeda8,
                         in_stack_ffffffffffffeda0,(char *)in_stack_ffffffffffffed98,
                         in_stack_ffffffffffffed90,
                         (char *)CONCAT44(in_stack_ffffffffffffed8c,in_stack_ffffffffffffed88),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffedc0);
            }
          }
        }
        poVar9 = std::operator<<((ostream *)local_510,"BOUNDS");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        local_570 = 0;
        while (uVar6 = local_570,
              iVar5 = nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x305c6a), (int)uVar6 < iVar5) {
          lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                (int)((ulong)this_01 >> 0x20));
          upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                (int)((ulong)this_01 >> 0x20));
          bVar3 = boost::multiprecision::operator==
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)this_01,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x305cbb);
          if (bVar3) {
            getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_ffffffffffffed08,(int)((ulong)in_stack_ffffffffffffed00 >> 0x20),
                       in_stack_ffffffffffffecf8,
                       (char *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
            local_1b0 = lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                              (int)((ulong)this_01 >> 0x20));
            local_1a8 = local_d90 + 0x38;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                       (cpp_dec_float<50U,_int,_void> *)this_01);
            local_d98 = (DataKey *)0x0;
            local_370 = local_d90;
            local_378 = &local_d98;
            local_380 = 0;
            local_f8 = local_378;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                       (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
            this_01 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)local_d90;
            MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_ffffffffffffedb0,(char *)in_stack_ffffffffffffeda8,
                       in_stack_ffffffffffffeda0,(char *)in_stack_ffffffffffffed98,
                       in_stack_ffffffffffffed90,(char *)CONCAT44(uVar6,in_stack_ffffffffffffed88),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffedc0);
          }
          else {
            lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                  (int)((ulong)this_01 >> 0x20));
            puVar10 = (ulong *)infinity();
            local_dd8 = (pointer)(*puVar10 ^ 0x8000000000000000);
            local_358 = local_dd0;
            local_360 = &local_dd8;
            local_368 = 0;
            local_100 = local_360;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                       (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
            tVar4 = boost::multiprecision::operator<=
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)this_01,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x305e94);
            local_1291 = false;
            if (tVar4) {
              upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                    (int)((ulong)this_01 >> 0x20));
              local_348 = infinity();
              local_340 = local_e10;
              local_350 = 0;
              local_108 = local_348;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                        (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                         (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
              local_1291 = boost::multiprecision::operator>=
                                     ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)this_01,
                                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)0x305f2a);
            }
            if (local_1291 == false) {
              lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                    (int)((ulong)this_01 >> 0x20));
              local_f48._176_8_ = (pointer)0x0;
              tVar4 = boost::multiprecision::operator!=
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)this_01,(double *)0x3060ac);
              if (tVar4) {
                lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                      (int)((ulong)this_01 >> 0x20));
                puVar10 = (ulong *)infinity();
                local_f48._112_8_ = *puVar10 ^ 0x8000000000000000;
                local_2f8 = local_f48 + 0x78;
                local_300 = local_f48 + 0x70;
                local_308 = 0;
                local_120 = local_300;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<double>
                          (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                           (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
                tVar4 = boost::multiprecision::operator>
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)this_01,
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)0x306162);
                iVar5 = (int)((ulong)in_stack_ffffffffffffed00 >> 0x20);
                if (tVar4) {
                  getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (in_stack_ffffffffffffed08,iVar5,in_stack_ffffffffffffecf8,
                             (char *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
                  local_1a0 = lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0)
                                    ,(int)((ulong)this_01 >> 0x20));
                  local_198 = local_f48 + 0x38;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<50U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                             (cpp_dec_float<50U,_int,_void> *)this_01);
                  local_f50 = (DataKey *)0x0;
                  local_2e0 = local_f48;
                  local_2e8 = &local_f50;
                  local_2f0 = 0;
                  local_128 = local_2e8;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<double>
                            (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                             (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
                  this_01 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)local_f48;
                  MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (in_stack_ffffffffffffedb0,(char *)in_stack_ffffffffffffeda8,
                             in_stack_ffffffffffffeda0,(char *)in_stack_ffffffffffffed98,
                             in_stack_ffffffffffffed90,
                             (char *)CONCAT44(uVar6,in_stack_ffffffffffffed88),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffedc0);
                }
                else {
                  getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (in_stack_ffffffffffffed08,iVar5,in_stack_ffffffffffffecf8,
                             (char *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
                  local_f90 = (pointer)0x0;
                  local_2c8 = local_f88;
                  local_2d0 = &local_f90;
                  local_2d8 = 0;
                  local_130 = local_2d0;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<double>
                            (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                             (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
                  local_fd0 = (pointer)0x0;
                  local_2b0 = local_fc8;
                  local_2b8 = &local_fd0;
                  local_2c0 = 0;
                  local_138 = local_2b8;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<double>
                            (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                             (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
                  this_01 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)local_fc8;
                  MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (in_stack_ffffffffffffedb0,(char *)in_stack_ffffffffffffeda8,
                             in_stack_ffffffffffffeda0,(char *)in_stack_ffffffffffffed98,
                             in_stack_ffffffffffffed90,
                             (char *)CONCAT44(uVar6,in_stack_ffffffffffffed88),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffedc0);
                }
              }
              if (((local_7a1 & 1U) == 0) ||
                 (iVar5 = IdxSet::pos((IdxSet *)in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf4)
                 , iVar5 < 0)) {
                in_stack_ffffffffffffed08 =
                     (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                              (int)((ulong)this_01 >> 0x20));
                local_288 = infinity();
                local_280 = local_10f0 + 0x70;
                local_290 = 0;
                local_148 = local_288;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<double>
                          (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                           (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
                tVar4 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)this_01,
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)0x30657d);
                if (tVar4) {
                  in_stack_ffffffffffffecf8 = local_510;
                  in_stack_ffffffffffffed00 =
                       (cpp_dec_float<50U,_int,_void> *)
                       getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                 (in_stack_ffffffffffffed08,
                                  (int)((ulong)in_stack_ffffffffffffed00 >> 0x20),local_510,
                                  (char *)CONCAT44(in_stack_ffffffffffffecf4,
                                                   in_stack_ffffffffffffecf0));
                  local_180 = upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0)
                                    ,(int)((ulong)this_01 >> 0x20));
                  local_178 = local_10f0 + 0x38;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<50U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                             (cpp_dec_float<50U,_int,_void> *)this_01);
                  local_10f8 = 0;
                  local_268 = local_10f0;
                  local_270 = &local_10f8;
                  local_278 = 0;
                  local_150 = local_270;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<double>
                            (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                             (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
                  this_01 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)local_10f0;
                  MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (in_stack_ffffffffffffedb0,(char *)in_stack_ffffffffffffeda8,
                             in_stack_ffffffffffffeda0,(char *)in_stack_ffffffffffffed98,
                             in_stack_ffffffffffffed90,
                             (char *)CONCAT44(uVar6,in_stack_ffffffffffffed88),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffedc0);
                }
              }
              else {
                getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (in_stack_ffffffffffffed08,(int)((ulong)in_stack_ffffffffffffed00 >> 0x20)
                           ,in_stack_ffffffffffffecf8,
                           (char *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
                local_190 = upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                                  (int)((ulong)this_01 >> 0x20));
                local_188 = local_1008;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                           (cpp_dec_float<50U,_int,_void> *)this_01);
                local_10f0._168_8_ = (pointer)0x0;
                local_298 = local_10f0 + 0xb0;
                local_2a0 = local_10f0 + 0xa8;
                local_2a8 = 0;
                local_140 = local_2a0;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<double>
                          (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                           (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
                this_01 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)(local_10f0 + 0xb0);
                MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (in_stack_ffffffffffffedb0,(char *)in_stack_ffffffffffffeda8,
                           in_stack_ffffffffffffeda0,(char *)in_stack_ffffffffffffed98,
                           in_stack_ffffffffffffed90,
                           (char *)CONCAT44(uVar6,in_stack_ffffffffffffed88),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffedc0);
              }
            }
            else {
              getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_ffffffffffffed08,(int)((ulong)in_stack_ffffffffffffed00 >> 0x20),
                         in_stack_ffffffffffffecf8,
                         (char *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
              local_e88._56_4_ = 0;
              local_e88._60_4_ = 0;
              local_328 = local_e48;
              local_330 = local_e88 + 0x38;
              local_338 = 0;
              local_110 = local_330;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                        (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                         (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
              local_e90 = (pointer)0x0;
              local_310 = local_e88;
              local_318 = &local_e90;
              local_320 = 0;
              local_118 = local_318;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                        (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                         (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
              this_01 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)local_e88;
              MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_ffffffffffffedb0,(char *)in_stack_ffffffffffffeda8,
                         in_stack_ffffffffffffeda0,(char *)in_stack_ffffffffffffed98,
                         in_stack_ffffffffffffed90,(char *)CONCAT44(uVar6,in_stack_ffffffffffffed88)
                         ,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_ffffffffffffedc0);
            }
          }
          local_570 = local_570 + 1;
        }
        poVar9 = std::operator<<((ostream *)local_510,"ENDATA");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        SVar7 = spxSense(in_RDI);
        if (((SVar7 == MAXIMIZE) && (in_RDI->spxout != (SPxOut *)0x0)) &&
           (VVar8 = SPxOut::getVerbosity(in_RDI->spxout), 0 < (int)VVar8)) {
          local_10fc = SPxOut::getVerbosity(in_RDI->spxout);
          local_1100 = 1;
          (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_1100);
          soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0)
                             ,(char *)this_01);
          (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_10fc);
        }
        return;
      }
      local_9a8 = 0;
      local_400 = local_9a0;
      local_408 = &local_9a8;
      local_410 = 0;
      local_c8 = local_408;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                 (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
      local_9e8 = (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0;
      local_3e8 = local_9e0;
      local_3f0 = &local_9e8;
      local_3f8 = 0;
      local_d0 = local_3f0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                 (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
      for (; uVar6 = local_570,
          iVar5 = nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x305366), (int)uVar6 < iVar5; local_570 = local_570 + 1) {
        local_220 = lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                        (int)((ulong)this_01 >> 0x20));
        local_218 = local_a58;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                   (cpp_dec_float<50U,_int,_void> *)this_01);
        local_210 = rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                        (int)((ulong)this_01 >> 0x20));
        local_208 = local_a90;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                   (cpp_dec_float<50U,_int,_void> *)this_01);
        MPSgetRHS<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8);
        local_158 = local_9a0;
        local_160 = local_a20;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                   (cpp_dec_float<50U,_int,_void> *)this_01);
        local_a98._0_4_ = ~MINIMIZE;
        local_a98._4_4_ = 0;
        tVar4 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)this_01,(double *)0x305474);
        if (tVar4) break;
      }
      uVar2 = local_570;
      iVar5 = nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x3054af);
      uVar6 = local_570;
    } while (iVar5 <= (int)uVar2);
    do {
      local_574 = uVar6 + 1;
      uVar6 = local_574;
      iVar5 = nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x3054ec);
      if (iVar5 <= (int)uVar6) break;
      local_200 = lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                      (int)((ulong)this_01 >> 0x20));
      local_1f8 = local_b08;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                 (cpp_dec_float<50U,_int,_void> *)this_01);
      local_1f0 = rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                      (int)((ulong)this_01 >> 0x20));
      local_1e8 = local_b40;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                 (cpp_dec_float<50U,_int,_void> *)this_01);
      MPSgetRHS<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8);
      local_168 = local_9e0;
      local_170 = local_ad0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                 (cpp_dec_float<50U,_int,_void> *)this_01);
      local_b48 = 0.0;
      tVar4 = boost::multiprecision::operator!=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)this_01,(double *)0x3055fa);
      uVar6 = local_574;
    } while (!tVar4);
    uVar6 = local_574;
    iVar5 = nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x305635);
    idx = (int)((ulong)in_stack_ffffffffffffed00 >> 0x20);
    if ((int)uVar6 < iVar5) {
      in_stack_ffffffffffffedd0 = local_510;
      MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (in_stack_ffffffffffffed08,idx,in_stack_ffffffffffffecf8,
                 (char *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
      local_1d8 = local_b80;
      local_1e0 = local_9a0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                 (cpp_dec_float<50U,_int,_void> *)this_01);
      MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (in_stack_ffffffffffffed08,(int)((ulong)in_stack_ffffffffffffed00 >> 0x20),
                 in_stack_ffffffffffffecf8,
                 (char *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
      local_1c8 = local_c28 + 0x70;
      local_1d0 = local_9e0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                 (cpp_dec_float<50U,_int,_void> *)this_01);
      this_01 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)(local_c28 + 0x70);
      MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (in_stack_ffffffffffffedb0,(char *)in_stack_ffffffffffffeda8,
                 in_stack_ffffffffffffeda0,(char *)in_stack_ffffffffffffed98,
                 in_stack_ffffffffffffed90,
                 (char *)CONCAT44(in_stack_ffffffffffffed8c,in_stack_ffffffffffffed88),
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_ffffffffffffedc0);
    }
    else {
      in_stack_ffffffffffffedc0 = local_510;
      in_stack_ffffffffffffedc8 =
           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_ffffffffffffed08,idx,in_stack_ffffffffffffecf8,
                         (char *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
      local_1b8 = local_c28 + 0x38;
      local_1c0 = local_9a0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                 (cpp_dec_float<50U,_int,_void> *)this_01);
      local_c30 = (Item *)0x0;
      local_3d0 = local_c28;
      local_3d8 = &local_c30;
      local_3e0 = 0;
      local_d8 = local_3d8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffed00,(double)in_stack_ffffffffffffecf8,
                 (type *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0));
      this_01 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_c28;
      MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (in_stack_ffffffffffffedb0,(char *)in_stack_ffffffffffffeda8,
                 in_stack_ffffffffffffeda0,(char *)in_stack_ffffffffffffed98,
                 in_stack_ffffffffffffed90,
                 (char *)CONCAT44(in_stack_ffffffffffffed8c,in_stack_ffffffffffffed88),
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_ffffffffffffedc0);
    }
    local_570 = local_574 + 1;
  } while( true );
}

Assistant:

inline
void SPxLPBase<R>::writeMPS(
   std::ostream&  p_output,          ///< output stream.
   const NameSet* p_rnames,          ///< row names.
   const NameSet* p_cnames,          ///< column names.
   const DIdxSet* p_intvars,         ///< integer variables.
   const bool     writeZeroObjective ///< write zero objective coefficients
) const
{

   const char*    indicator;
   char           name [16];
   char           name1[16];
   char           name2[16];
   bool           has_ranges = false;
   int            i;
   int            k;

   SPxOut::setScientific(p_output, 16);
   // --- NAME Section ---
   p_output << "NAME          MPSDATA" << std::endl;

   // --- ROWS Section ---
   p_output << "ROWS" << std::endl;

   for(i = 0; i < nRows(); i++)
   {
      if(lhs(i) == rhs(i))
         indicator = "E";
      else if((lhs(i) > R(-infinity)) && (rhs(i) < R(infinity)))
      {
         indicator = "E";
         has_ranges = true;
      }
      else if(lhs(i) > R(-infinity))
         indicator = "G";
      else if(rhs(i) <  R(infinity))
         indicator = "L";
      else
         throw SPxInternalCodeException("XMPSWR02 This should never happen.");

      MPSwriteRecord<R>(p_output, indicator, MPSgetRowName(*this, i, p_rnames, name));
   }

   MPSwriteRecord<R>(p_output, "N", "MINIMIZE");

   // --- COLUMNS Section ---
   p_output << "COLUMNS" << std::endl;

   bool has_intvars = (p_intvars != nullptr) && (p_intvars->size() > 0);

   for(int j = 0; j < (has_intvars ? 2 : 1); j++)
   {
      bool is_intrun = has_intvars && (j == 1);

      if(is_intrun)
         p_output << "    MARK0001  'MARKER'                 'INTORG'" << std::endl;

      for(i = 0; i < nCols(); i++)
      {
         bool is_intvar = has_intvars && (p_intvars->pos(i) >= 0);

         if((is_intrun && !is_intvar) || (!is_intrun &&  is_intvar))
            continue;

         const SVectorBase<R>& col = colVector(i);
         int colsize2 = (col.size() / 2) * 2;

         assert(colsize2 % 2 == 0);

         for(k = 0; k < colsize2; k += 2)
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name),
                           MPSgetRowName(*this, col.index(k), p_rnames, name1), col.value(k),
                           MPSgetRowName(*this, col.index(k + 1), p_rnames, name2), col.value(k + 1));

         if(colsize2 != col.size())
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name),
                           MPSgetRowName(*this, col.index(k), p_rnames, name1), col.value(k));

         if(isNotZero(maxObj(i), this->tolerances()->epsilon()) || writeZeroObjective)
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name), "MINIMIZE", -maxObj(i));
      }

      if(is_intrun)
         p_output << "    MARK0001  'MARKER'                 'INTEND'" << std::endl;
   }

   // --- RHS Section ---
   p_output << "RHS" << std::endl;

   i = 0;

   while(i < nRows())
   {
      R rhsval1 = 0.0;
      R rhsval2 = 0.0;

      for(; i < nRows(); i++)
         if((rhsval1 = MPSgetRHS(lhs(i), rhs(i))) != 0.0)
            break;

      if(i < nRows())
      {
         for(k = i + 1; k < nRows(); k++)
         {
            if((rhsval2 = MPSgetRHS(lhs(k), rhs(k))) != 0.0)
               break;
         }

         if(k < nRows())
         {
            MPSwriteRecord(p_output, nullptr, "RHS", MPSgetRowName(*this, i, p_rnames, name1), rhsval1,
                           MPSgetRowName(*this, k, p_rnames, name2), rhsval2);
         }
         else
            MPSwriteRecord(p_output, nullptr, "RHS", MPSgetRowName(*this, i, p_rnames, name1), rhsval1);

         i = k + 1;
      }
   }

   // --- RANGES Section ---
   if(has_ranges)
   {
      p_output << "RANGES" << std::endl;

      for(i = 0; i < nRows(); i++)
      {
         if((lhs(i) > R(-infinity)) && (rhs(i) < R(infinity)))
            MPSwriteRecord(p_output, "", "RANGE", MPSgetRowName(*this, i, p_rnames, name1), rhs(i) - lhs(i));
      }
   }

   // --- BOUNDS Section ---
   p_output << "BOUNDS" << std::endl;

   for(i = 0; i < nCols(); i++)
   {
      if(lower(i) == upper(i))
      {
         MPSwriteRecord(p_output, "FX", "BOUND", getColName(*this, i, p_cnames, name1), lower(i));
         continue;
      }

      if((lower(i) <= R(-infinity)) && (upper(i) >= R(infinity)))
      {
         MPSwriteRecord<R>(p_output, "FR", "BOUND", getColName(*this, i, p_cnames, name1));
         continue;
      }

      if(lower(i) != 0.0)
      {
         if(lower(i) > R(-infinity))
            MPSwriteRecord(p_output, "LO", "BOUND", getColName(*this, i, p_cnames, name1), lower(i));
         else
            MPSwriteRecord<R>(p_output, "MI", "BOUND", getColName(*this, i, p_cnames, name1));
      }

      if(has_intvars && (p_intvars->pos(i) >= 0))
      {
         // Integer variables have default upper bound 1.0, but we should write
         // it nevertheless since CPLEX seems to assume R(infinity) otherwise.
         MPSwriteRecord(p_output, "UP", "BOUND", getColName(*this, i, p_cnames, name1), upper(i));
      }
      else
      {
         // Continous variables have default upper bound R(infinity)
         if(upper(i) < R(infinity))
            MPSwriteRecord(p_output, "UP", "BOUND", getColName(*this, i, p_cnames, name1), upper(i));
      }
   }

   // --- ENDATA Section ---
   p_output << "ENDATA" << std::endl;

   // Output warning when writing a maximisation problem
   if(spxSense() == SPxLPBase<R>::MAXIMIZE)
   {
      SPX_MSG_WARNING((*spxout), (*spxout) <<
                      "XMPSWR03 Warning: objective function inverted when writing maximization problem in MPS file format\n");
   }
}